

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo
          (cmLocalUnixMakefileGenerator3 *this,ostream *cmakefileStream,cmGeneratorTarget *target)

{
  _Rb_tree_node_base *lang;
  cmMakefile *pcVar1;
  pointer pbVar2;
  bool bVar3;
  ImplicitDependLanguageMap *pIVar4;
  _Rb_tree_header *p_Var5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  char *pcVar9;
  cmState *pcVar10;
  long lVar11;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  pointer pbVar12;
  _Base_ptr p_Var13;
  long lVar14;
  const_iterator __first;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c0;
  allocator local_2a1;
  NotInProjectDir local_2a0;
  cmGeneratorTarget *local_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transformRules;
  string binaryDir;
  NotInProjectDir local_190;
  string local_150 [32];
  undefined1 local_130 [64];
  string local_f0;
  string cidVar;
  NotInProjectDir local_b0;
  NotInProjectDir local_70;
  
  local_260 = target;
  pIVar4 = GetImplicitDepends(this,target);
  std::operator<<(cmakefileStream,
                  "# The set of languages for which implicit dependencies are needed:\n");
  std::operator<<(cmakefileStream,"set(CMAKE_DEPENDS_LANGUAGES\n");
  p_Var5 = &(pIVar4->
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap>_>_>
            )._M_t._M_impl.super__Rb_tree_header;
  for (p_Var7 = (pIVar4->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap>_>_>
                )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var5; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    poVar6 = std::operator<<(cmakefileStream,"  \"");
    poVar6 = std::operator<<(poVar6,(string *)(p_Var7 + 1));
    std::operator<<(poVar6,"\"\n");
  }
  std::operator<<(cmakefileStream,"  )\n");
  std::operator<<(cmakefileStream,"# The set of files for implicit dependencies of each language:\n"
                 );
  p_Var7 = (pIVar4->
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap>_>_>
           )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var7 == p_Var5) {
      transformRules.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      transformRules.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      transformRules.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      std::__cxx11::string::string
                ((string *)&local_2a0,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM",(allocator *)&local_190);
      pcVar9 = cmMakefile::GetProperty(pcVar1,&local_2a0.SourceDir);
      std::__cxx11::string::~string((string *)&local_2a0);
      if (pcVar9 != (char *)0x0) {
        std::__cxx11::string::string((string *)&local_2a0,pcVar9,(allocator *)&local_190);
        cmSystemTools::ExpandListArgument(&local_2a0.SourceDir,&transformRules,false);
        std::__cxx11::string::~string((string *)&local_2a0);
      }
      std::__cxx11::string::string
                ((string *)&local_2a0,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM",(allocator *)&local_190);
      pcVar9 = cmGeneratorTarget::GetProperty(local_260,&local_2a0.SourceDir);
      std::__cxx11::string::~string((string *)&local_2a0);
      if (pcVar9 != (char *)0x0) {
        std::__cxx11::string::string((string *)&local_2a0,pcVar9,(allocator *)&local_190);
        cmSystemTools::ExpandListArgument(&local_2a0.SourceDir,&transformRules,false);
        std::__cxx11::string::~string((string *)&local_2a0);
      }
      if (transformRules.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          transformRules.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::operator<<(cmakefileStream,"set(CMAKE_INCLUDE_TRANSFORMS\n");
        for (pbVar12 = transformRules.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pbVar12 !=
            transformRules.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; pbVar12 = pbVar12 + 1) {
          poVar6 = std::operator<<(cmakefileStream,"  ");
          cmOutputConverter::EscapeForCMake(&local_2a0.SourceDir,pbVar12);
          poVar6 = std::operator<<(poVar6,(string *)&local_2a0);
          std::operator<<(poVar6,"\n");
          std::__cxx11::string::~string((string *)&local_2a0);
        }
        std::operator<<(cmakefileStream,"  )\n");
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&transformRules);
      return;
    }
    poVar6 = std::operator<<(cmakefileStream,"set(CMAKE_DEPENDS_CHECK_");
    lang = p_Var7 + 1;
    poVar6 = std::operator<<(poVar6,(string *)lang);
    std::operator<<(poVar6,"\n");
    for (p_Var8 = p_Var7[2]._M_right; p_Var8 != (_Base_ptr)&p_Var7[2]._M_parent;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      for (p_Var13 = *(_Base_ptr *)(p_Var8 + 2); p_Var13 != p_Var8[2]._M_parent;
          p_Var13 = p_Var13 + 1) {
        poVar6 = std::operator<<(cmakefileStream,"  \"");
        poVar6 = std::operator<<(poVar6,(string *)p_Var13);
        std::operator<<(poVar6,"\" ");
        poVar6 = std::operator<<(cmakefileStream,"\"");
        poVar6 = std::operator<<(poVar6,(string *)(p_Var8 + 1));
        std::operator<<(poVar6,"\"\n");
      }
    }
    std::operator<<(cmakefileStream,"  )\n");
    std::__cxx11::string::string((string *)&cidVar,"CMAKE_",(allocator *)&local_2a0);
    std::__cxx11::string::append((string *)&cidVar);
    std::__cxx11::string::append((char *)&cidVar);
    pcVar9 = cmMakefile::GetDefinition
                       ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,&cidVar
                       );
    if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
      poVar6 = std::operator<<(cmakefileStream,"set(CMAKE_");
      poVar6 = std::operator<<(poVar6,(string *)lang);
      poVar6 = std::operator<<(poVar6,"_COMPILER_ID \"");
      poVar6 = std::operator<<(poVar6,pcVar9);
      std::operator<<(poVar6,"\")\n");
    }
    defines._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    defines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    defines._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &defines._M_t._M_impl.super__Rb_tree_header._M_header;
    defines._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    defines._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         defines._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    cmLocalGenerator::AddCompileDefinitions
              ((cmLocalGenerator *)this,&defines,local_260,
               &(this->super_cmLocalCommonGenerator).ConfigName,(string *)lang);
    if (defines._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      poVar6 = std::operator<<(cmakefileStream,"\n");
      poVar6 = std::operator<<(poVar6,"# Preprocessor definitions for this target.\n");
      poVar6 = std::operator<<(poVar6,"set(CMAKE_TARGET_DEFINITIONS_");
      poVar6 = std::operator<<(poVar6,(string *)lang);
      std::operator<<(poVar6,"\n");
      for (p_Var8 = defines._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &defines._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        poVar6 = std::operator<<(cmakefileStream,"  ");
        cmOutputConverter::EscapeForCMake(&local_2a0.SourceDir,(string *)(p_Var8 + 1));
        poVar6 = std::operator<<(poVar6,(string *)&local_2a0);
        std::operator<<(poVar6,"\n");
        std::__cxx11::string::~string((string *)&local_2a0);
      }
      std::operator<<(cmakefileStream,"  )\n");
    }
    poVar6 = std::operator<<(cmakefileStream,"\n");
    std::operator<<(poVar6,"# The include file search paths:\n");
    poVar6 = std::operator<<(cmakefileStream,"set(CMAKE_");
    poVar6 = std::operator<<(poVar6,(string *)lang);
    std::operator<<(poVar6,"_TARGET_INCLUDE_PATH\n");
    includes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    includes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    includes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string
              ((string *)&local_2a0,"CMAKE_BUILD_TYPE",(allocator *)&transformRules);
    pcVar9 = cmMakefile::GetSafeDefinition(pcVar1,&local_2a0.SourceDir);
    std::__cxx11::string::string((string *)&local_f0,pcVar9,(allocator *)&local_190);
    std::__cxx11::string::~string((string *)&local_2a0);
    cmLocalGenerator::GetIncludeDirectories
              ((cmLocalGenerator *)this,&includes,local_260,(string *)lang,&local_f0,true);
    pcVar10 = cmLocalGenerator::GetState((cmLocalGenerator *)this);
    pcVar9 = cmState::GetBinaryDirectory(pcVar10);
    std::__cxx11::string::string((string *)&binaryDir,pcVar9,(allocator *)&local_2a0);
    pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string
              ((string *)&local_2a0,"CMAKE_DEPENDS_IN_PROJECT_ONLY",(allocator *)&transformRules);
    bVar3 = cmMakefile::IsOn(pcVar1,&local_2a0.SourceDir);
    std::__cxx11::string::~string((string *)&local_2a0);
    if (bVar3) {
      pcVar10 = cmLocalGenerator::GetState((cmLocalGenerator *)this);
      pcVar9 = cmState::GetSourceDirectory(pcVar10);
      std::__cxx11::string::string(local_150,pcVar9,&local_2a1);
      std::__cxx11::string::string((string *)local_130,local_150);
      std::__cxx11::string::string((string *)(local_130 + 0x20),(string *)&binaryDir);
      pbVar2 = includes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar12 = includes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_2c0._M_current =
           includes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      anon_unknown.dwarf_9ddf8c::NotInProjectDir::NotInProjectDir
                (&local_b0,(NotInProjectDir *)local_130);
      anon_unknown.dwarf_9ddf8c::NotInProjectDir::NotInProjectDir(&local_70,&local_b0);
      anon_unknown.dwarf_9ddf8c::NotInProjectDir::NotInProjectDir(&local_2a0,&local_70);
      anon_unknown.dwarf_9ddf8c::NotInProjectDir::NotInProjectDir(&local_190,&local_2a0);
      anon_unknown.dwarf_9ddf8c::NotInProjectDir::~NotInProjectDir(&local_2a0);
      anon_unknown.dwarf_9ddf8c::NotInProjectDir::NotInProjectDir
                ((NotInProjectDir *)&transformRules,&local_190);
      anon_unknown.dwarf_9ddf8c::NotInProjectDir::NotInProjectDir
                (&local_2a0,(NotInProjectDir *)&transformRules);
      lVar14 = (long)pbVar2 - (long)pbVar12;
      for (lVar11 = lVar14 >> 7; 0 < lVar11; lVar11 = lVar11 + -1) {
        bVar3 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                          ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)&local_2a0,
                           local_2c0);
        __it._M_current = local_2c0._M_current;
        if (bVar3) goto LAB_003ee85c;
        bVar3 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                          ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)&local_2a0,
                           local_2c0._M_current + 1);
        __it._M_current = local_2c0._M_current + 1;
        if (bVar3) goto LAB_003ee85c;
        bVar3 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                          ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)&local_2a0,
                           local_2c0._M_current + 2);
        __it._M_current = local_2c0._M_current + 2;
        if (bVar3) goto LAB_003ee85c;
        bVar3 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                          ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)&local_2a0,
                           local_2c0._M_current + 3);
        __it._M_current = local_2c0._M_current + 3;
        if (bVar3) goto LAB_003ee85c;
        local_2c0._M_current = local_2c0._M_current + 4;
        lVar14 = lVar14 + -0x80;
      }
      lVar14 = lVar14 >> 5;
      if (lVar14 == 1) {
LAB_003ee9cb:
        bVar3 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                          ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)&local_2a0,
                           local_2c0);
        __it._M_current = local_2c0._M_current;
        if (!bVar3) {
          __it._M_current = pbVar2;
        }
      }
      else if (lVar14 == 2) {
LAB_003ee836:
        bVar3 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                          ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)&local_2a0,
                           local_2c0);
        __it._M_current = local_2c0._M_current;
        if (!bVar3) {
          local_2c0._M_current = local_2c0._M_current + 1;
          goto LAB_003ee9cb;
        }
      }
      else {
        __it._M_current = pbVar2;
        if ((lVar14 == 3) &&
           (bVar3 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                              ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)&local_2a0,
                               local_2c0), __it._M_current = local_2c0._M_current, !bVar3)) {
          local_2c0._M_current = local_2c0._M_current + 1;
          goto LAB_003ee836;
        }
      }
LAB_003ee85c:
      anon_unknown.dwarf_9ddf8c::NotInProjectDir::~NotInProjectDir(&local_2a0);
      anon_unknown.dwarf_9ddf8c::NotInProjectDir::~NotInProjectDir
                ((NotInProjectDir *)&transformRules);
      __first._M_current = __it._M_current;
      if (__it._M_current != pbVar2) {
        while (__it._M_current = __it._M_current + 1, __it._M_current != pbVar2) {
          bVar3 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                            ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)&local_190,__it);
          if (!bVar3) {
            std::__cxx11::string::operator=((string *)__first._M_current,(string *)__it._M_current);
            __first._M_current = __first._M_current + 1;
          }
        }
      }
      anon_unknown.dwarf_9ddf8c::NotInProjectDir::~NotInProjectDir(&local_190);
      anon_unknown.dwarf_9ddf8c::NotInProjectDir::~NotInProjectDir(&local_70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&includes,__first,
              (const_iterator)
              includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
      anon_unknown.dwarf_9ddf8c::NotInProjectDir::~NotInProjectDir(&local_b0);
      anon_unknown.dwarf_9ddf8c::NotInProjectDir::~NotInProjectDir((NotInProjectDir *)local_130);
      std::__cxx11::string::~string(local_150);
    }
    for (pbVar12 = includes.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar12 !=
        includes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar12 = pbVar12 + 1) {
      poVar6 = std::operator<<(cmakefileStream,"  \"");
      MaybeConvertToRelativePath(&local_2a0.SourceDir,this,&binaryDir,pbVar12);
      poVar6 = std::operator<<(poVar6,(string *)&local_2a0);
      std::operator<<(poVar6,"\"\n");
      std::__cxx11::string::~string((string *)&local_2a0);
    }
    std::operator<<(cmakefileStream,"  )\n");
    std::__cxx11::string::~string((string *)&binaryDir);
    std::__cxx11::string::~string((string *)&local_f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&includes);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&defines._M_t);
    std::__cxx11::string::~string((string *)&cidVar);
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo(
  std::ostream& cmakefileStream, cmGeneratorTarget* target)
{
  ImplicitDependLanguageMap const& implicitLangs =
    this->GetImplicitDepends(target);

  // list the languages
  cmakefileStream
    << "# The set of languages for which implicit dependencies are needed:\n";
  cmakefileStream << "set(CMAKE_DEPENDS_LANGUAGES\n";
  for (ImplicitDependLanguageMap::const_iterator l = implicitLangs.begin();
       l != implicitLangs.end(); ++l) {
    cmakefileStream << "  \"" << l->first << "\"\n";
  }
  cmakefileStream << "  )\n";

  // now list the files for each language
  cmakefileStream
    << "# The set of files for implicit dependencies of each language:\n";
  for (ImplicitDependLanguageMap::const_iterator l = implicitLangs.begin();
       l != implicitLangs.end(); ++l) {
    cmakefileStream << "set(CMAKE_DEPENDS_CHECK_" << l->first << "\n";
    ImplicitDependFileMap const& implicitPairs = l->second;

    // for each file pair
    for (ImplicitDependFileMap::const_iterator pi = implicitPairs.begin();
         pi != implicitPairs.end(); ++pi) {
      for (cmDepends::DependencyVector::const_iterator di = pi->second.begin();
           di != pi->second.end(); ++di) {
        cmakefileStream << "  \"" << *di << "\" ";
        cmakefileStream << "\"" << pi->first << "\"\n";
      }
    }
    cmakefileStream << "  )\n";

    // Tell the dependency scanner what compiler is used.
    std::string cidVar = "CMAKE_";
    cidVar += l->first;
    cidVar += "_COMPILER_ID";
    const char* cid = this->Makefile->GetDefinition(cidVar);
    if (cid && *cid) {
      cmakefileStream << "set(CMAKE_" << l->first << "_COMPILER_ID \"" << cid
                      << "\")\n";
    }

    // Build a list of preprocessor definitions for the target.
    std::set<std::string> defines;
    this->AddCompileDefinitions(defines, target, this->ConfigName, l->first);
    if (!defines.empty()) {
      /* clang-format off */
      cmakefileStream
        << "\n"
        << "# Preprocessor definitions for this target.\n"
        << "set(CMAKE_TARGET_DEFINITIONS_" << l->first << "\n";
      /* clang-format on */
      for (std::set<std::string>::const_iterator di = defines.begin();
           di != defines.end(); ++di) {
        cmakefileStream << "  " << cmOutputConverter::EscapeForCMake(*di)
                        << "\n";
      }
      cmakefileStream << "  )\n";
    }

    // Target-specific include directories:
    cmakefileStream << "\n"
                    << "# The include file search paths:\n";
    cmakefileStream << "set(CMAKE_" << l->first << "_TARGET_INCLUDE_PATH\n";
    std::vector<std::string> includes;

    const std::string& config =
      this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
    this->GetIncludeDirectories(includes, target, l->first, config);
    std::string binaryDir = this->GetState()->GetBinaryDirectory();
    if (this->Makefile->IsOn("CMAKE_DEPENDS_IN_PROJECT_ONLY")) {
      const char* sourceDir = this->GetState()->GetSourceDirectory();
      cmEraseIf(includes, ::NotInProjectDir(sourceDir, binaryDir));
    }
    for (std::vector<std::string>::iterator i = includes.begin();
         i != includes.end(); ++i) {
      cmakefileStream << "  \""
                      << this->MaybeConvertToRelativePath(binaryDir, *i)
                      << "\"\n";
    }
    cmakefileStream << "  )\n";
  }

  // Store include transform rule properties.  Write the directory
  // rules first because they may be overridden by later target rules.
  std::vector<std::string> transformRules;
  if (const char* xform =
        this->Makefile->GetProperty("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM")) {
    cmSystemTools::ExpandListArgument(xform, transformRules);
  }
  if (const char* xform =
        target->GetProperty("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM")) {
    cmSystemTools::ExpandListArgument(xform, transformRules);
  }
  if (!transformRules.empty()) {
    cmakefileStream << "set(CMAKE_INCLUDE_TRANSFORMS\n";
    for (std::vector<std::string>::const_iterator tri = transformRules.begin();
         tri != transformRules.end(); ++tri) {
      cmakefileStream << "  " << cmOutputConverter::EscapeForCMake(*tri)
                      << "\n";
    }
    cmakefileStream << "  )\n";
  }
}